

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMemory.cpp
# Opt level: O3

void * xercesc_4_0::XMemory::operator_new(size_t size,MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (manager != (MemoryManager *)0x0) {
    iVar1 = (*manager->_vptr_MemoryManager[3])(manager,size + 8);
    *(undefined8 *)CONCAT44(extraout_var,iVar1) = manager;
    return (undefined8 *)CONCAT44(extraout_var,iVar1) + 1;
  }
  __assert_fail("manager != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMemory.cpp"
                ,0x3f,"static void *xercesc_4_0::XMemory::operator new(size_t, MemoryManager *)");
}

Assistant:

void* XMemory::operator new(size_t size, MemoryManager* manager)
{
    assert(manager != 0);
	
    size_t headerSize = XMLPlatformUtils::alignPointerForNewBlockAllocation(
       sizeof(MemoryManager*));
       
    void* const block = manager->allocate(headerSize + size);
    *(MemoryManager**)block = manager;

    return (char*)block + headerSize;
}